

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O3

unique_ptr<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>_> __thiscall
PCCompatible::Machine::PCCompatible(Machine *this,Target *target,ROMFetcher *rom_fetcher)

{
  Target *target_00;
  ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *this_00;
  
  this_00 = (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *)0x0;
  target_00 = (Target *)
              __dynamic_cast(target,&Analyser::Static::Target::typeinfo,
                             &Analyser::Static::PCCompatible::Target::typeinfo,0);
  if (target_00->adaptor == CGA) {
    this_00 = (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *)
              operator_new(0x100770);
    ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::ConcreteMachine
              (this_00,target_00,rom_fetcher);
  }
  else if (target_00->adaptor == MDA) {
    this_00 = (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *)
              operator_new(0x100748);
    ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::ConcreteMachine
              ((ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *)this_00,
               target_00,rom_fetcher);
  }
  this->_vptr_Machine = (_func_int **)this_00;
  return (__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
          )(__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Machine> Machine::PCCompatible(const Analyser::Static::Target *target, const ROMMachine::ROMFetcher &rom_fetcher) {
	const Target *const pc_target = dynamic_cast<const Target *>(target);

	switch(pc_target->adaptor) {
		case Target::VideoAdaptor::MDA:	return std::make_unique<PCCompatible::ConcreteMachine<Target::VideoAdaptor::MDA>>(*pc_target, rom_fetcher);
		case Target::VideoAdaptor::CGA:	return std::make_unique<PCCompatible::ConcreteMachine<Target::VideoAdaptor::CGA>>(*pc_target, rom_fetcher);
		default: return nullptr;
	}
}